

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int target_set_capabilities(TARGET_HANDLE target,AMQP_VALUE capabilities_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE capabilities_amqp_value;
  TARGET_INSTANCE *target_instance;
  int result;
  AMQP_VALUE capabilities_value_local;
  TARGET_HANDLE target_local;
  
  if (target == (TARGET_HANDLE)0x0) {
    target_instance._4_4_ = 0x3854;
  }
  else {
    if (capabilities_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(capabilities_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      target_instance._4_4_ = 0x3864;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(target->composite_value,6,local_30);
      if (iVar1 == 0) {
        target_instance._4_4_ = 0;
      }
      else {
        target_instance._4_4_ = 0x386a;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return target_instance._4_4_;
}

Assistant:

int target_set_capabilities(TARGET_HANDLE target, AMQP_VALUE capabilities_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        AMQP_VALUE capabilities_amqp_value;
        if (capabilities_value == NULL)
        {
            capabilities_amqp_value = NULL;
        }
        else
        {
            capabilities_amqp_value = amqpvalue_clone(capabilities_value);
        }
        if (capabilities_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(target_instance->composite_value, 6, capabilities_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(capabilities_amqp_value);
        }
    }

    return result;
}